

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_mqtt_common.c
# Opt level: O2

MQTT_CLIENT_ACK_OPTION mqttNotificationCallback(MQTT_MESSAGE_HANDLE msgHandle,void *callbackCtx)

{
  IOTHUB_SYSTEM_PROPERTY_TYPE propertyType;
  code *pcVar1;
  bool bVar2;
  char cVar3;
  uint16_t uVar4;
  int iVar5;
  IOTHUB_MESSAGE_RESULT IVar6;
  int iVar7;
  MAP_RESULT MVar8;
  QOS_VALUE QVar9;
  char *pcVar10;
  char *pcVar11;
  size_t sVar12;
  LOGGER_LOG p_Var13;
  undefined8 *__ptr;
  size_t sVar14;
  APP_PAYLOAD *pAVar15;
  IOTHUB_MESSAGE_HANDLE iotHubMessageHandle;
  char *pcVar16;
  STRING_TOKENIZER_HANDLE_conflict pSVar17;
  STRING_HANDLE pSVar18;
  MAP_HANDLE handle;
  size_t sVar19;
  STRING_HANDLE pSVar20;
  STRING_HANDLE pSVar21;
  MESSAGE_DISPOSITION_CONTEXT_HANDLE dispositionContext;
  long lVar22;
  PDLIST_ENTRY Entry;
  bool bVar23;
  undefined8 in_stack_ffffffffffffff88;
  undefined4 uVar24;
  ulong local_68;
  STRING_HANDLE local_60;
  
  uVar24 = (undefined4)((ulong)in_stack_ffffffffffffff88 >> 0x20);
  if (callbackCtx == (void *)0x0 || msgHandle == (MQTT_MESSAGE_HANDLE)0x0) {
    return MQTT_CLIENT_ACK_NONE;
  }
  pcVar10 = mqttmessage_getTopicName(msgHandle);
  if (pcVar10 == (char *)0x0) {
    p_Var13 = xlogging_get_log_function();
    if (p_Var13 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar10 = "mqttNotificationCallback";
    pcVar11 = "Failure: NULL topic name encountered";
    iVar5 = 0x7f8;
    goto LAB_0012ddbf;
  }
  iVar5 = InternStrnicmp(pcVar10,"$iothub/twin",0xc);
  if (iVar5 == 0) {
    pSVar17 = STRING_TOKENIZER_create_from_char(pcVar10);
    if (pSVar17 == (STRING_TOKENIZER_HANDLE_conflict)0x0) {
      p_Var13 = xlogging_get_log_function();
      if (p_Var13 != (LOGGER_LOG)0x0) {
        (*p_Var13)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"parseDeviceTwinTopicInfo",0x23a,1,
                   "Failed creating token from device twin topic.");
      }
    }
    else {
      pSVar18 = STRING_new();
      if (pSVar18 == (STRING_HANDLE)0x0) {
        p_Var13 = xlogging_get_log_function();
        if (p_Var13 != (LOGGER_LOG)0x0) {
          (*p_Var13)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"parseDeviceTwinTopicInfo",0x245,1,"Failed allocating new string .");
        }
        local_68 = 0;
        local_60 = (STRING_HANDLE)0x0;
        bVar2 = false;
        bVar23 = false;
      }
      else {
        lVar22 = 0;
        local_60 = pSVar18;
        while( true ) {
          iVar5 = STRING_TOKENIZER_get_next_token(pSVar17,pSVar18,"/");
          bVar23 = iVar5 == 0;
          if (!bVar23) break;
          if (lVar22 == 2) {
            pcVar10 = STRING_c_str(pSVar18);
            iVar5 = strcmp(pcVar10,"PATCH");
            if (iVar5 == 0) {
              local_60 = (STRING_HANDLE)0x0;
              break;
            }
          }
          else if (lVar22 == 3) {
            pcVar10 = STRING_c_str(pSVar18);
            local_60 = (STRING_HANDLE)atol(pcVar10);
          }
          else if (lVar22 == 4) {
            pcVar10 = STRING_c_str(pSVar18);
            iVar5 = strncmp(pcVar10,"?$rid=",6);
            if (iVar5 == 0) {
              local_68 = atol(pcVar10 + 6);
              bVar23 = true;
              bVar2 = false;
            }
            else {
              p_Var13 = xlogging_get_log_function();
              if (p_Var13 != (LOGGER_LOG)0x0) {
                (*p_Var13)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                           ,"parseDeviceTwinTopicInfo",0x266,1,
                           "requestId does not begin with string format %s","?$rid=");
              }
              local_68 = 0;
              bVar23 = false;
              bVar2 = false;
            }
            goto LAB_0012dd46;
          }
          lVar22 = lVar22 + 1;
        }
        local_68 = 0;
        bVar2 = bVar23;
LAB_0012dd46:
        STRING_delete(pSVar18);
      }
      STRING_TOKENIZER_destroy(pSVar17);
      if (bVar23) {
        pAVar15 = mqttmessage_getApplicationMsg(msgHandle);
        if (pAVar15 == (APP_PAYLOAD *)0x0) {
          p_Var13 = xlogging_get_log_function();
          if (p_Var13 == (LOGGER_LOG)0x0) {
            return MQTT_CLIENT_ACK_NONE;
          }
          pcVar10 = "processTwinNotification";
          pcVar11 = "Failure: invalid payload";
          iVar5 = 0x735;
          goto LAB_0012ddbf;
        }
        if (bVar2) {
          (**(code **)((long)callbackCtx + 0x150))
                    (1,pAVar15->message,pAVar15->length,*(undefined8 *)((long)callbackCtx + 0x168));
          return MQTT_CLIENT_ACK_NONE;
        }
        Entry = (PDLIST_ENTRY)((long)callbackCtx + 0xd0);
        do {
          Entry = Entry->Flink;
          if (Entry == (PDLIST_ENTRY)((long)callbackCtx + 0xd0)) {
            return MQTT_CLIENT_ACK_NONE;
          }
        } while (local_68 != *(ushort *)&Entry[-2].Blink);
        DList_RemoveEntryList(Entry);
        if (*(int *)&Entry[-1].Blink == 1) {
          if (Entry[1].Flink != (DLIST_ENTRY_TAG *)0x0) {
            (*(code *)Entry[1].Flink)(0,pAVar15->message,pAVar15->length,Entry[1].Blink);
            goto LAB_0012e66c;
          }
          (**(code **)((long)callbackCtx + 0x150))
                    (0,pAVar15->message,pAVar15->length,*(undefined8 *)((long)callbackCtx + 0x168));
        }
        else {
          (**(code **)((long)callbackCtx + 0x148))
                    (*(undefined4 *)((long)&Entry[-2].Blink + 4),(ulong)local_60 & 0xffffffff,
                     *(undefined8 *)((long)callbackCtx + 0x168));
        }
        subscribeToNotifyStateIfNeeded((PMQTTTRANSPORT_HANDLE_DATA)callbackCtx);
LAB_0012e66c:
        free(Entry + -3);
        return MQTT_CLIENT_ACK_NONE;
      }
    }
    p_Var13 = xlogging_get_log_function();
    if (p_Var13 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar10 = "processTwinNotification";
    pcVar11 = "Failure: parsing device topic info";
    iVar5 = 0x72e;
    goto LAB_0012ddbf;
  }
  iVar5 = InternStrnicmp(pcVar10,"$iothub/methods",0xf);
  if (iVar5 == 0) {
    pSVar18 = STRING_new();
    if (pSVar18 != (STRING_HANDLE)0x0) {
      __ptr = (undefined8 *)malloc(8);
      if (__ptr == (undefined8 *)0x0) {
        p_Var13 = xlogging_get_log_function();
        if (p_Var13 != (LOGGER_LOG)0x0) {
          pcVar10 = "Failure: allocating DEVICE_METHOD_INFO object";
          iVar5 = 0x773;
LAB_0012dc2a:
          (*p_Var13)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"processDeviceMethodNotification",iVar5,1,pcVar10);
        }
      }
      else {
        pSVar20 = STRING_new();
        *__ptr = pSVar20;
        if (pSVar20 == (STRING_HANDLE)0x0) {
          p_Var13 = xlogging_get_log_function();
          if (p_Var13 != (LOGGER_LOG)0x0) {
            (*p_Var13)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                       ,"processDeviceMethodNotification",0x77a,1,
                       "Failure constructing request_id string");
          }
        }
        else {
          pSVar17 = STRING_TOKENIZER_create_from_char(pcVar10);
          if (pSVar17 == (STRING_TOKENIZER_HANDLE_conflict)0x0) {
            p_Var13 = xlogging_get_log_function();
            if (p_Var13 != (LOGGER_LOG)0x0) {
              (*p_Var13)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"retrieveDeviceMethodRidInfo",0x1f8,1,
                         "Failed creating token from device twin topic.");
            }
          }
          else {
            pSVar21 = STRING_new();
            if (pSVar21 == (STRING_HANDLE)0x0) {
              p_Var13 = xlogging_get_log_function();
              if (p_Var13 != (LOGGER_LOG)0x0) {
                (*p_Var13)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                           ,"retrieveDeviceMethodRidInfo",0x200,1,"Failed allocating new string .");
              }
              STRING_TOKENIZER_destroy(pSVar17);
            }
            else {
              lVar22 = 0;
              while (iVar5 = STRING_TOKENIZER_get_next_token(pSVar17,pSVar21,"/"), iVar5 == 0) {
                if (lVar22 == 4) {
                  sVar14 = STRING_length(pSVar21);
                  if (5 < sVar14) {
                    pcVar10 = STRING_c_str(pSVar21);
                    iVar5 = bcmp(pcVar10,"?$rid=",6);
                    if (iVar5 == 0) {
                      iVar5 = STRING_concat(pSVar20,pcVar10 + 6);
                      if (iVar5 == 0) {
                        STRING_delete(pSVar21);
                        STRING_TOKENIZER_destroy(pSVar17);
                        pAVar15 = mqttmessage_getApplicationMsg(msgHandle);
                        if (pAVar15 != (APP_PAYLOAD *)0x0) {
                          pcVar1 = *(code **)((long)callbackCtx + 0x158);
                          pcVar10 = STRING_c_str(pSVar18);
                          iVar5 = (*pcVar1)(pcVar10,pAVar15->message,pAVar15->length,__ptr,
                                            *(undefined8 *)((long)callbackCtx + 0x168));
                          if ((iVar5 == 0) ||
                             (p_Var13 = xlogging_get_log_function(), p_Var13 == (LOGGER_LOG)0x0))
                          goto LAB_0012e785;
                          pcVar10 = "Failure: IoTHubClientCore_LL_DeviceMethodComplete";
                          iVar5 = 0x78e;
                          goto LAB_0012dc2a;
                        }
                        p_Var13 = xlogging_get_log_function();
                        if (p_Var13 != (LOGGER_LOG)0x0) {
                          (*p_Var13)(AZ_LOG_ERROR,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                     ,"processDeviceMethodNotification",0x788,1,
                                     "Failure: mqttmessage_getApplicationMsg");
                        }
                        STRING_delete(pSVar20);
                        free(__ptr);
                        goto LAB_0012e785;
                      }
                      p_Var13 = xlogging_get_log_function();
                      if (p_Var13 != (LOGGER_LOG)0x0) {
                        pcVar10 = "Failed STRING_concat failed.";
                        iVar5 = 0x21c;
                        goto LAB_0012e71f;
                      }
                      break;
                    }
                  }
                }
                else if ((lVar22 == 3) &&
                        (iVar5 = STRING_concat_with_STRING(pSVar18,pSVar21), iVar5 != 0)) {
                  p_Var13 = xlogging_get_log_function();
                  if (p_Var13 != (LOGGER_LOG)0x0) {
                    pcVar10 = "Failed STRING_concat_with_STRING.";
                    iVar5 = 0x20e;
LAB_0012e71f:
                    (*p_Var13)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                               ,"retrieveDeviceMethodRidInfo",iVar5,1,pcVar10);
                  }
                  break;
                }
                lVar22 = lVar22 + 1;
              }
              STRING_delete(pSVar21);
              STRING_TOKENIZER_destroy(pSVar17);
            }
          }
          p_Var13 = xlogging_get_log_function();
          if (p_Var13 != (LOGGER_LOG)0x0) {
            (*p_Var13)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                       ,"processDeviceMethodNotification",0x77f,1,
                       "Failure: retrieve device topic info");
          }
          STRING_delete(pSVar20);
        }
        free(__ptr);
      }
LAB_0012e785:
      STRING_delete(pSVar18);
      return MQTT_CLIENT_ACK_NONE;
    }
    p_Var13 = xlogging_get_log_function();
    if (p_Var13 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar10 = "processDeviceMethodNotification";
    pcVar11 = "Failure: allocating method_name string value";
    iVar5 = 0x76c;
    goto LAB_0012ddbf;
  }
  pcVar11 = STRING_c_str(*(STRING_HANDLE *)((long)callbackCtx + 8));
  if (pcVar11 == (char *)0x0) {
LAB_0012d744:
    pcVar11 = STRING_c_str(*(STRING_HANDLE *)((long)callbackCtx + 0x20));
    if (pcVar11 != (char *)0x0) {
      sVar12 = strlen(pcVar11);
      iVar5 = InternStrnicmp(pcVar10,pcVar11,sVar12 - 1);
      if (iVar5 == 0) {
        iVar5 = 3;
        bVar23 = true;
        goto LAB_0012da74;
      }
    }
    p_Var13 = xlogging_get_log_function();
    if (p_Var13 != (LOGGER_LOG)0x0) {
      (*p_Var13)(AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                 ,"retrieveTopicType",0x29d,1,"Topic %s does not match any client is subscribed to",
                 pcVar10);
    }
    p_Var13 = xlogging_get_log_function();
    if (p_Var13 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar10 = "mqttNotificationCallback";
    pcVar11 = "Received unexpected topic.  Ignoring remainder of request";
    iVar5 = 0x7fc;
LAB_0012ddbf:
    (*p_Var13)(AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
               ,pcVar10,iVar5,1,pcVar11);
    return MQTT_CLIENT_ACK_NONE;
  }
  sVar12 = strlen(pcVar11);
  iVar5 = InternStrnicmp(pcVar10,pcVar11,sVar12 - 1);
  if (iVar5 != 0) goto LAB_0012d744;
  bVar23 = false;
  iVar5 = 0;
LAB_0012da74:
  pAVar15 = mqttmessage_getApplicationMsg(msgHandle);
  if (pAVar15 == (APP_PAYLOAD *)0x0) {
    p_Var13 = xlogging_get_log_function();
    if (p_Var13 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar10 = "processIncomingMessageNotification";
    pcVar11 = "Failure: invalid appPayload.";
    iVar5 = 0x7b6;
    goto LAB_0012ddbf;
  }
  iotHubMessageHandle = IoTHubMessage_CreateFromByteArray(pAVar15->message,pAVar15->length);
  if (iotHubMessageHandle == (IOTHUB_MESSAGE_HANDLE)0x0) {
    p_Var13 = xlogging_get_log_function();
    if (p_Var13 == (LOGGER_LOG)0x0) {
      return MQTT_CLIENT_ACK_NONE;
    }
    pcVar10 = "processIncomingMessageNotification";
    pcVar11 = "Failure: IotHub Message creation has failed.";
    iVar5 = 0x7ba;
    goto LAB_0012ddbf;
  }
  if (iVar5 == 0) {
    pcVar11 = STRING_c_str(*(STRING_HANDLE *)((long)callbackCtx + 8));
    sVar12 = strlen(pcVar11);
    pcVar10 = pcVar10 + (sVar12 - 1);
    if (pcVar10 == (char *)0x0) goto LAB_0012def7;
LAB_0012dff1:
    if (*pcVar10 != '\0') {
      pSVar17 = STRING_TOKENIZER_create_from_char(pcVar10);
      if (pSVar17 == (STRING_TOKENIZER_HANDLE_conflict)0x0) {
        p_Var13 = xlogging_get_log_function();
        if (p_Var13 == (LOGGER_LOG)0x0) goto LAB_0012e561;
        pcVar10 = "failure allocating tokenizer";
        iVar5 = 0x6e1;
LAB_0012df2a:
        (*p_Var13)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"extractMqttProperties",iVar5,1,pcVar10);
        goto LAB_0012e561;
      }
      pSVar18 = STRING_new();
      if (pSVar18 == (STRING_HANDLE)0x0) {
        p_Var13 = xlogging_get_log_function();
        if (p_Var13 == (LOGGER_LOG)0x0) {
          pSVar18 = (STRING_HANDLE)0x0;
        }
        else {
          pcVar10 = "Failure to allocate STRING_new.";
          pSVar18 = (STRING_HANDLE)0x0;
          iVar5 = 0x6e6;
LAB_0012e86a:
          (*p_Var13)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"extractMqttProperties",iVar5,1,pcVar10);
        }
        goto LAB_0012e564;
      }
      handle = IoTHubMessage_Properties(iotHubMessageHandle);
      if (handle == (MAP_HANDLE)0x0) {
        p_Var13 = xlogging_get_log_function();
        if (p_Var13 != (LOGGER_LOG)0x0) {
          pcVar10 = "Failure to retrieve IoTHubMessage_properties.";
          iVar5 = 0x6eb;
          goto LAB_0012e86a;
        }
        goto LAB_0012e564;
      }
      iVar5 = 0;
LAB_0012e050:
      iVar7 = STRING_TOKENIZER_get_next_token(pSVar17,pSVar18,"&");
      if (iVar7 == 0 && iVar5 == 0) {
        pcVar10 = STRING_c_str(pSVar18);
        iVar5 = 0;
        if ((pcVar10 != (char *)0x0) && (*pcVar10 != '\0')) {
          pcVar11 = strchr(pcVar10,0x3d);
          iVar5 = 0;
          if ((pcVar11 != (char *)0x0) && (pcVar11[1] != '\0')) {
            pcVar16 = pcVar11 + 1;
            sVar12 = (long)pcVar11 - (long)pcVar10;
            for (lVar22 = 8; lVar22 != 0xe8; lVar22 = lVar22 + 0x10) {
              pcVar11 = *(char **)((long)&symm_key_interface.hsm_client_set_symm_key_info + lVar22);
              sVar19 = strlen(pcVar11);
              if ((sVar19 == sVar12) && (iVar5 = bcmp(pcVar10,pcVar11,sVar12), iVar5 == 0)) {
                propertyType = *(IOTHUB_SYSTEM_PROPERTY_TYPE *)
                                ((long)&sysPropList[0].propName + lVar22);
                iVar5 = 0;
                if (propertyType == IOTHUB_SYSTEM_PROPERTY_TYPE_SILENTLY_IGNORE) goto LAB_0012e050;
                if (propertyType != IOTHUB_SYSTEM_PROPERTY_TYPE_APPLICATION_CUSTOM) {
                  if (*(char *)((long)callbackCtx + 0x108) == '\x01') {
                    pSVar20 = URL_DecodeString(pcVar16);
                    if (pSVar20 == (STRING_HANDLE)0x0) {
                      p_Var13 = xlogging_get_log_function();
                      iVar5 = 0x6aa;
                      if (p_Var13 != (LOGGER_LOG)0x0) {
                        iVar7 = 0x6a9;
                        pcVar10 = "Failed to URL decode property value";
LAB_0012e430:
                        (*p_Var13)(AZ_LOG_ERROR,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                   ,"addSystemPropertyToMessageWithDecodeIfNeeded",iVar7,1,pcVar10);
                      }
                    }
                    else {
                      pcVar10 = STRING_c_str(pSVar20);
                      iVar7 = addSystemPropertyToMessage(iotHubMessageHandle,propertyType,pcVar10);
                      if (iVar7 != 0) {
                        p_Var13 = xlogging_get_log_function();
                        iVar5 = 0x6af;
                        if (p_Var13 != (LOGGER_LOG)0x0) {
                          iVar7 = 0x6ae;
                          pcVar10 = "Unable to set message property";
                          goto LAB_0012e430;
                        }
                      }
                    }
                    STRING_delete(pSVar20);
                  }
                  else {
                    iVar7 = addSystemPropertyToMessage(iotHubMessageHandle,propertyType,pcVar16);
                    iVar5 = 0;
                    if (iVar7 != 0) {
                      p_Var13 = xlogging_get_log_function();
                      iVar5 = 0x6b8;
                      if (p_Var13 != (LOGGER_LOG)0x0) {
                        (*p_Var13)(AZ_LOG_ERROR,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                                   ,"addSystemPropertyToMessageWithDecodeIfNeeded",0x6b7,1,
                                   "Unable to set message property");
                      }
                    }
                  }
                  goto LAB_0012e050;
                }
                break;
              }
            }
            sVar19 = sVar12 + 1;
            if (sVar12 + 1 == 0) {
              sVar19 = 0xffffffffffffffff;
            }
            if (sVar19 == 0xffffffffffffffff) {
LAB_0012e209:
              p_Var13 = xlogging_get_log_function();
              iVar5 = 0x675;
              if (p_Var13 != (LOGGER_LOG)0x0) {
                (*p_Var13)(AZ_LOG_ERROR,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                           ,"addApplicationPropertyToMessage",0x674,1,
                           "Failed allocating property information, size:%zu",sVar19);
              }
              pcVar11 = (char *)0x0;
            }
            else {
              cVar3 = *(char *)((long)callbackCtx + 0x108);
              pcVar11 = (char *)malloc(sVar19);
              if (pcVar11 == (char *)0x0) goto LAB_0012e209;
              memcpy(pcVar11,pcVar10,sVar12);
              pcVar11[sVar12] = '\0';
              if (cVar3 == '\0') {
                MVar8 = Map_AddOrUpdate(handle,pcVar11,pcVar16);
                iVar5 = 0;
                if (MVar8 != MAP_OK) {
                  p_Var13 = xlogging_get_log_function();
                  iVar5 = 0x694;
                  if (p_Var13 != (LOGGER_LOG)0x0) {
                    (*p_Var13)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                               ,"addApplicationPropertyToMessage",0x693,1,"Map_AddOrUpdate failed.")
                    ;
                  }
                }
              }
              else {
                pSVar20 = URL_DecodeString(pcVar11);
                pSVar21 = URL_DecodeString(pcVar16);
                if ((pSVar20 == (STRING_HANDLE)0x0) || (pSVar21 == (STRING_HANDLE)0x0)) {
                  p_Var13 = xlogging_get_log_function();
                  iVar5 = 0x683;
                  if (p_Var13 != (LOGGER_LOG)0x0) {
                    iVar7 = 0x682;
                    pcVar10 = "Failed to URL decode property";
LAB_0012e375:
                    (*p_Var13)(AZ_LOG_ERROR,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                               ,"addApplicationPropertyToMessage",iVar7,1,pcVar10);
                  }
                }
                else {
                  pcVar10 = STRING_c_str(pSVar20);
                  pcVar16 = STRING_c_str(pSVar21);
                  MVar8 = Map_AddOrUpdate(handle,pcVar10,pcVar16);
                  iVar5 = 0;
                  if (MVar8 != MAP_OK) {
                    p_Var13 = xlogging_get_log_function();
                    iVar5 = 0x688;
                    if (p_Var13 != (LOGGER_LOG)0x0) {
                      iVar7 = 0x687;
                      pcVar10 = "Map_AddOrUpdate failed.";
                      goto LAB_0012e375;
                    }
                  }
                }
                STRING_delete(pSVar21);
                STRING_delete(pSVar20);
              }
            }
            free(pcVar11);
          }
        }
        goto LAB_0012e050;
      }
      STRING_delete(pSVar18);
      STRING_TOKENIZER_destroy(pSVar17);
      if (iVar5 == 0) goto LAB_0012e45f;
      goto LAB_0012e574;
    }
    STRING_delete((STRING_HANDLE)0x0);
    STRING_TOKENIZER_destroy((STRING_TOKENIZER_HANDLE_conflict)0x0);
LAB_0012e45f:
    dispositionContext = (MESSAGE_DISPOSITION_CONTEXT_HANDLE)malloc(8);
    if (dispositionContext == (MESSAGE_DISPOSITION_CONTEXT_HANDLE)0x0) {
      p_Var13 = xlogging_get_log_function();
      if (p_Var13 != (LOGGER_LOG)0x0) {
        (*p_Var13)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"createMessageDispositionContext",0x7a1,1,
                   "Failed allocating MESSAGE_DISPOSITION_CONTEXT");
      }
      p_Var13 = xlogging_get_log_function();
      if (p_Var13 == (LOGGER_LOG)0x0) goto LAB_0012e5a6;
      pcVar10 = "failed creating message disposition context";
      iVar5 = 0x7c7;
    }
    else {
      uVar4 = mqttmessage_getPacketId(msgHandle);
      dispositionContext->packet_id = uVar4;
      QVar9 = mqttmessage_getQosType(msgHandle);
      dispositionContext->qos_value = QVar9;
      IVar6 = IoTHubMessage_SetDispositionContext
                        (iotHubMessageHandle,dispositionContext,destroyMessageDispositionContext);
      if (IVar6 != IOTHUB_MESSAGE_OK) {
        p_Var13 = xlogging_get_log_function();
        if (p_Var13 != (LOGGER_LOG)0x0) {
          (*p_Var13)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"processIncomingMessageNotification",0x7cc,1,
                     "Failed setting disposition context in IOTHUB_MESSAGE_HANDLE");
        }
        free(dispositionContext);
        goto LAB_0012e5a6;
      }
      if (bVar23) {
        cVar3 = (**(code **)((long)callbackCtx + 0x120))();
        if (cVar3 != '\0') {
          return MQTT_CLIENT_ACK_NONE;
        }
        p_Var13 = xlogging_get_log_function();
        if (p_Var13 == (LOGGER_LOG)0x0) goto LAB_0012e5a6;
        pcVar10 = "IoTHubClientCore_LL_MessageCallbackFromInput returned false";
        iVar5 = 0x7d6;
      }
      else {
        cVar3 = (**(code **)((long)callbackCtx + 0x128))
                          (iotHubMessageHandle,*(undefined8 *)((long)callbackCtx + 0x168));
        if (cVar3 != '\0') {
          return MQTT_CLIENT_ACK_NONE;
        }
        p_Var13 = xlogging_get_log_function();
        if (p_Var13 == (LOGGER_LOG)0x0) goto LAB_0012e5a6;
        pcVar10 = "IoTHubClientCore_LL_MessageCallback returned false";
        iVar5 = 0x7e0;
      }
    }
  }
  else {
    if (iVar5 == 3) {
      pcVar11 = STRING_c_str(*(STRING_HANDLE *)((long)callbackCtx + 0x20));
      sVar12 = strlen(pcVar11);
      if (pcVar10 + (sVar12 - 1) == (char *)0x0) goto LAB_0012def7;
      pcVar11 = strchr(pcVar10 + (sVar12 - 1),0x2f);
      if ((pcVar11 == (char *)0x0) || (pcVar11[1] == '\0')) {
        p_Var13 = xlogging_get_log_function();
        if (p_Var13 != (LOGGER_LOG)0x0) {
          pcVar10 = "Cannot find \'/\' to mark beginning of input name";
          iVar5 = 0x596;
LAB_0012dfd4:
          (*p_Var13)(AZ_LOG_ERROR,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                     ,"addInputNamePropertyToMsg",iVar5,1,pcVar10);
        }
LAB_0012dfd9:
        pcVar16 = (char *)0x0;
        pcVar10 = (char *)0x0;
      }
      else {
        pcVar11 = pcVar11 + 1;
        pcVar10 = strchr(pcVar11,0x2f);
        if (pcVar10 == (char *)0x0) {
          p_Var13 = xlogging_get_log_function();
          if (p_Var13 != (LOGGER_LOG)0x0) {
            pcVar10 = "Cannot find \'/\' after input name";
            iVar5 = 0x59e;
            goto LAB_0012dfd4;
          }
          goto LAB_0012dfd9;
        }
        sVar12 = (long)pcVar10 - (long)pcVar11;
        if (pcVar10 < pcVar11) {
          sVar12 = 0xffffffffffffffff;
        }
        sVar19 = sVar12 + 1;
        if (sVar12 + 1 == 0) {
          sVar19 = 0xffffffffffffffff;
        }
        if ((sVar19 == 0xffffffffffffffff) ||
           (pcVar16 = (char *)malloc(sVar19), pcVar16 == (char *)0x0)) {
          p_Var13 = xlogging_get_log_function();
          if (p_Var13 != (LOGGER_LOG)0x0) {
            (*p_Var13)(AZ_LOG_ERROR,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                       ,"addInputNamePropertyToMsg",0x5a8,1,"Cannot allocate input name, size:%zu",
                       sVar19);
          }
          pcVar16 = (char *)0x0;
          pcVar10 = (char *)0x0;
        }
        else {
          memcpy(pcVar16,pcVar11,sVar12);
          pcVar16[sVar12] = '\0';
          IVar6 = IoTHubMessage_SetInputName(iotHubMessageHandle,pcVar16);
          if (IVar6 == IOTHUB_MESSAGE_OK) {
            pcVar10 = pcVar10 + 1;
          }
          else {
            p_Var13 = xlogging_get_log_function();
            if (p_Var13 == (LOGGER_LOG)0x0) {
              pcVar10 = (char *)0x0;
            }
            else {
              pcVar10 = (char *)0x0;
              (*p_Var13)(AZ_LOG_ERROR,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                         ,"addInputNamePropertyToMsg",0x5b2,1,"Failed adding input name to msg");
            }
          }
        }
      }
      free(pcVar16);
      if (pcVar10 != (char *)0x0) goto LAB_0012dff1;
      p_Var13 = xlogging_get_log_function();
      if (p_Var13 != (LOGGER_LOG)0x0) {
        pcVar10 = "failure adding input name to property.";
        iVar5 = 0x6d7;
        goto LAB_0012df2a;
      }
    }
    else {
      p_Var13 = xlogging_get_log_function();
      if (p_Var13 != (LOGGER_LOG)0x0) {
        (*p_Var13)(AZ_LOG_ERROR,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
                   ,"findMessagePropertyStart",0x65c,1,"ERROR: type %d is not expected",
                   CONCAT44(uVar24,iVar5));
      }
LAB_0012def7:
      p_Var13 = xlogging_get_log_function();
      if (p_Var13 != (LOGGER_LOG)0x0) {
        pcVar10 = "Cannot find start of properties";
        iVar5 = 0x6d2;
        goto LAB_0012df2a;
      }
    }
LAB_0012e561:
    pSVar18 = (STRING_HANDLE)0x0;
    pSVar17 = (STRING_TOKENIZER_HANDLE_conflict)0x0;
LAB_0012e564:
    STRING_delete(pSVar18);
    STRING_TOKENIZER_destroy(pSVar17);
LAB_0012e574:
    p_Var13 = xlogging_get_log_function();
    if (p_Var13 == (LOGGER_LOG)0x0) goto LAB_0012e5a6;
    pcVar10 = "failure extracting mqtt properties.";
    iVar5 = 0x7be;
  }
  (*p_Var13)(AZ_LOG_ERROR,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_mqtt_common.c"
             ,"processIncomingMessageNotification",iVar5,1,pcVar10);
LAB_0012e5a6:
  IoTHubMessage_Destroy(iotHubMessageHandle);
  return MQTT_CLIENT_ACK_NONE;
}

Assistant:

static MQTT_CLIENT_ACK_OPTION mqttNotificationCallback(MQTT_MESSAGE_HANDLE msgHandle, void* callbackCtx)
{
    if (msgHandle != NULL && callbackCtx != NULL)
    {
        PMQTTTRANSPORT_HANDLE_DATA transportData = (PMQTTTRANSPORT_HANDLE_DATA)callbackCtx;
        IOTHUB_IDENTITY_TYPE type;

        const char* topicName = mqttmessage_getTopicName(msgHandle);
        if (topicName == NULL)
        {
            LogError("Failure: NULL topic name encountered");
        }
        else if (retrieveTopicType(transportData, topicName, &type) != 0)
        {
            LogError("Received unexpected topic.  Ignoring remainder of request");
        }
        else
        {
            if (type == IOTHUB_TYPE_DEVICE_TWIN)
            {
                processTwinNotification(transportData, msgHandle, topicName);
            }
            else if (type == IOTHUB_TYPE_DEVICE_METHODS)
            {
                processDeviceMethodNotification(transportData, msgHandle, topicName);
            }
            else
            {
                processIncomingMessageNotification(transportData, msgHandle, topicName, type);
            }
        }
    }

    return MQTT_CLIENT_ACK_NONE;
}